

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::move(BTreeImpl *this,Leaf *dst,uint dstPos,Leaf *src)

{
  Leaf *src_local;
  uint dstPos_local;
  Leaf *dst_local;
  BTreeImpl *this_local;
  
  memcpy(dst,src,0x40);
  if (src->next == 0) {
    this->endLeaf = dstPos;
  }
  else {
    this->tree[src->next].field_0.freelist.zero[0] = dstPos;
  }
  if (src->prev == 0) {
    this->beginLeaf = dstPos;
  }
  else {
    this->tree[src->prev].field_0.leaf.next = dstPos;
  }
  return;
}

Assistant:

void BTreeImpl::move(Leaf& dst, uint dstPos, Leaf& src) {
  dst = src;
  if (src.next == 0) {
    endLeaf = dstPos;
  } else {
    tree[src.next].leaf.prev = dstPos;
  }
  if (src.prev == 0) {
    beginLeaf = dstPos;
  } else {
    tree[src.prev].leaf.next = dstPos;
  }
}